

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O2

void peer_change_user_data(void)

{
  WaitResult<bool> WVar1;
  FindUserDataCallable find_peer2;
  Peer peer2;
  Peer peer1;
  allocator local_111;
  string local_110;
  undefined1 local_f0 [40];
  Peer local_c8;
  PeerParameters local_b0;
  Peer local_80;
  FindUserDataCallable local_68;
  FindUserDataCallable local_40;
  
  local_b0.min_supported_protocol_version_ = kProtocolVersion1;
  local_b0.max_supported_protocol_version_ = kProtocolVersion1;
  local_b0.can_use_broadcast_ = true;
  local_b0.can_use_multicast_ = false;
  local_b0.discovered_peer_ttl_ms_ = 10000;
  local_b0.discover_self_ = false;
  local_b0.same_peer_mode_ = kSamePeerIpAndPort;
  local_b0.can_be_discovered_ = true;
  local_b0.can_discover_ = true;
  local_b0.port_ = 0x2ef5;
  local_b0.multicast_group_address_ = 0xe000007b;
  local_b0.application_id_ = 0x753584;
  local_b0.send_timeout_ms_ = 100;
  udpdiscovery::Peer::Peer(&local_80);
  std::__cxx11::string::string((string *)local_f0,"peer 1",(allocator *)&local_110);
  udpdiscovery::Peer::Start(&local_80,&local_b0,(string *)local_f0);
  std::__cxx11::string::_M_dispose();
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer(&local_c8);
  std::__cxx11::string::string((string *)local_f0,"peer 2",(allocator *)&local_110);
  udpdiscovery::Peer::Start(&local_c8,&local_b0,(string *)local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_110,"peer 2",&local_111);
  local_f0._0_8_ = &local_80;
  std::__cxx11::string::string((string *)(local_f0 + 8),(string *)&local_110);
  std::__cxx11::string::_M_dispose();
  FindUserDataCallable::FindUserDataCallable(&local_40,(FindUserDataCallable *)local_f0);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_40);
  std::__cxx11::string::_M_dispose();
  if (((uint3)WVar1 & 1) != 0) {
    __assert_fail("find.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xc4,"void peer_change_user_data()");
  }
  if (((uint3)WVar1 >> 8 & 1) == 0) {
    __assert_fail("find.has_result == true",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xc5,"void peer_change_user_data()");
  }
  std::__cxx11::string::string((string *)&local_110,"peer 2 updated user data",&local_111);
  udpdiscovery::Peer::SetUserData(&local_c8,&local_110);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_110,"peer 2 updated user data",&local_111);
  std::__cxx11::string::_M_assign((string *)(local_f0 + 8));
  std::__cxx11::string::_M_dispose();
  FindUserDataCallable::FindUserDataCallable(&local_68,(FindUserDataCallable *)local_f0);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_68);
  std::__cxx11::string::_M_dispose();
  if (((uint3)WVar1 & 1) != 0) {
    __assert_fail("find.is_timeout == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                  ,0xcc,"void peer_change_user_data()");
  }
  if (((uint3)WVar1 >> 8 & 1) != 0) {
    udpdiscovery::Peer::StopAndWaitForThreads(&local_80);
    udpdiscovery::Peer::StopAndWaitForThreads(&local_c8);
    std::__cxx11::string::_M_dispose();
    udpdiscovery::Peer::~Peer(&local_c8);
    udpdiscovery::Peer::~Peer(&local_80);
    return;
  }
  __assert_fail("find.has_result == true",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,0xcd,"void peer_change_user_data()");
}

Assistant:

void peer_change_user_data() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);
  peer_parameters.set_multicast_group_address(kMulticastAddress);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> find =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(find.is_timeout == false);
  assert(find.has_result == true);

  peer2.SetUserData("peer 2 updated user data");

  find_peer2.SetUserData("peer 2 updated user data");
  find = Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                    /* callable= */ find_peer2);
  assert(find.is_timeout == false);
  assert(find.has_result == true);

  peer1.StopAndWaitForThreads();
  peer2.StopAndWaitForThreads();
}